

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

vector<YAML::Node,_std::allocator<YAML::Node>_> * YAML::LoadAllFromFile(string *filename)

{
  byte bVar1;
  undefined8 uVar2;
  string *in_RSI;
  vector<YAML::Node,_std::allocator<YAML::Node>_> *in_RDI;
  ifstream fin;
  long local_218 [14];
  string *in_stack_fffffffffffffe58;
  BadFile *in_stack_fffffffffffffe60;
  istream *in_stack_fffffffffffffea8;
  
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    LoadAll(in_stack_fffffffffffffea8);
    std::ifstream::~ifstream(local_218);
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x40);
  BadFile::BadFile(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  __cxa_throw(uVar2,&BadFile::typeinfo,BadFile::~BadFile);
}

Assistant:

std::vector<Node> LoadAllFromFile(const std::string& filename) {
  std::ifstream fin(filename);
  if (!fin) {
    throw BadFile(filename);
  }
  return LoadAll(fin);
}